

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
emplace_back<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>&>
          (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *this,
          basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *args)

{
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar1;
  json_runtime_error<std::domain_error,_void> *this_00;
  allocator<char> local_31;
  string local_30;
  
  for (; ((byte)*this & 0xf) == 9;
      this = *(basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> **)(this + 8)) {
  }
  if (((byte)*this & 0xf) == 0xe) {
    pbVar1 = json_array<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
             ::
             emplace_back<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>&>
                       (*(json_array<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
                          **)(this + 8),args);
    return pbVar1;
  }
  this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Attempting to insert into a value that is not an array",&local_31)
  ;
  json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_30);
  __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
              json_runtime_error<std::domain_error,_void>::~json_runtime_error);
}

Assistant:

basic_json& emplace_back(Args&&... args)
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    return cast<array_storage>().value().emplace_back(std::forward<Args>(args)...);
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().emplace_back(std::forward<Args>(args)...);
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to insert into a value that is not an array"));
            }
        }